

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall
amrex::FabArrayBase::flushTileArray(FabArrayBase *this,IntVect *tileSize,bool no_assertion)

{
  undefined8 uVar1;
  bool bVar2;
  pointer ppVar3;
  byte in_DL;
  _Base_ptr in_RSI;
  FabArrayBase *in_RDI;
  IntVect IVar4;
  iterator tai_it_1;
  IntVect *crse_ratio;
  TAMap *tai;
  const_iterator tai_it;
  iterator tao_it;
  TACache *tao;
  map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
  *in_stack_fffffffffffffe88;
  map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
  *this_00;
  _Base_ptr this_01;
  iterator __position;
  iterator __position_00;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 uVar5;
  _Self local_140;
  pair<amrex::IntVect,_amrex::IntVect> local_138;
  _Self local_120;
  int local_118 [3];
  IntVect local_104;
  IntVect *local_f8;
  map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
  *local_f0;
  _Base_ptr local_e0;
  iterator local_d8;
  _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
  local_d0;
  iterator local_c8;
  _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
  local_c0;
  int local_b8 [2];
  _Rb_tree_color local_b0;
  int local_a4;
  int iStack_a0;
  _Rb_tree_color local_9c;
  _Self local_98;
  _Self local_90;
  undefined1 *local_88;
  byte local_79;
  _Base_ptr local_78;
  byte *local_68;
  int *local_60;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  int local_20 [2];
  _Rb_tree_color local_18;
  IntVect local_c;
  
  local_79 = in_DL & 1;
  local_68 = &local_79;
  local_88 = m_TheTileArrayCache;
  local_78 = in_RSI;
  local_90._M_node =
       (_Base_ptr)
       std::
       map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
       ::find((map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
               *)in_stack_fffffffffffffe88,(key_type *)0x10111b1);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
       ::end((map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
              *)in_stack_fffffffffffffe88);
  bVar2 = std::operator!=(&local_90,&local_98);
  if (bVar2) {
    this_01 = local_78;
    IntVect::IntVect(&local_c,0);
    local_18 = local_c.vect[2];
    local_20[0] = local_c.vect[0];
    local_20[1] = local_c.vect[1];
    local_b0 = local_c.vect[2];
    local_b8[0] = local_c.vect[0];
    local_b8[1] = local_c.vect[1];
    local_a4 = local_c.vect[0];
    iStack_a0 = local_c.vect[1];
    uVar1 = _local_a4;
    local_9c = local_c.vect[2];
    local_60 = &local_a4;
    local_2c = 0;
    local_a4 = local_c.vect[0];
    uVar5 = false;
    if (*(int *)&((_Rep_type *)&this_01->_M_color)->_M_impl == local_a4) {
      local_3c = 1;
      iStack_a0 = local_c.vect[1];
      uVar5 = false;
      local_38 = local_60;
      if (*(int *)&this_01->field_0x4 == iStack_a0) {
        local_4c = 2;
        uVar5 = (((_Rb_tree_header *)&this_01->_M_parent)->_M_header)._M_color == local_c.vect[2];
        local_48 = local_60;
      }
    }
    _local_a4 = uVar1;
    local_28 = local_60;
    if ((bool)uVar5 == false) {
      __position_00._M_node = this_01;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
                             *)0x101143c);
      local_f0 = &ppVar3->second;
      boxArray(in_RDI);
      IVar4 = BoxArray::crseRatio((BoxArray *)CONCAT17(uVar5,in_stack_fffffffffffffea0));
      local_118._0_8_ = IVar4.vect._0_8_;
      local_104.vect[0] = local_118[0];
      local_104.vect[1] = local_118[1];
      local_118[2] = IVar4.vect[2];
      local_104.vect[2] = local_118[2];
      local_f8 = &local_104;
      this_00 = local_f0;
      local_118 = IVar4.vect;
      std::pair<amrex::IntVect,_amrex::IntVect>::pair<amrex::IntVect,_amrex::IntVect,_true>
                (&local_138,(IntVect *)local_78,local_f8);
      local_120._M_node =
           (_Base_ptr)
           std::
           map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
           ::find(this_00,(key_type *)0x10114b6);
      local_140._M_node =
           (_Base_ptr)
           std::
           map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
           ::end(this_00);
      bVar2 = std::operator!=(&local_120,&local_140);
      if (bVar2) {
        std::
        _Rb_tree_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
                      *)0x10114ec);
        CacheStats::recordErase
                  ((CacheStats *)CONCAT17(uVar5,in_stack_fffffffffffffea0),
                   (Long)__position_00._M_node);
        std::
        map<std::pair<amrex::IntVect,amrex::IntVect>,amrex::FabArrayBase::TileArray,std::less<std::pair<amrex::IntVect,amrex::IntVect>>,std::allocator<std::pair<std::pair<amrex::IntVect,amrex::IntVect>const,amrex::FabArrayBase::TileArray>>>
        ::erase_abi_cxx11_((map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
                            *)this_01,__position_00);
      }
    }
    else {
      __position._M_node = this_01;
      std::
      _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
                    *)0x1011358);
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
           ::begin(in_stack_fffffffffffffe88);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
      ::_Rb_tree_const_iterator(&local_c0,&local_c8);
      while( true ) {
        std::
        _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
                      *)0x101138e);
        local_d8._M_node =
             (_Base_ptr)
             std::
             map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
             ::end(in_stack_fffffffffffffe88);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
        ::_Rb_tree_const_iterator(&local_d0,&local_d8);
        bVar2 = std::operator!=(&local_c0,&local_d0);
        if (!bVar2) break;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
                      *)0x10113df);
        CacheStats::recordErase
                  ((CacheStats *)CONCAT17(uVar5,in_stack_fffffffffffffea0),(Long)__position._M_node)
        ;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
                      *)this_01);
      }
      local_e0 = local_90._M_node;
      std::
      map<amrex::FabArrayBase::BDKey,std::map<std::pair<amrex::IntVect,amrex::IntVect>,amrex::FabArrayBase::TileArray,std::less<std::pair<amrex::IntVect,amrex::IntVect>>,std::allocator<std::pair<std::pair<amrex::IntVect,amrex::IntVect>const,amrex::FabArrayBase::TileArray>>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,std::map<std::pair<amrex::IntVect,amrex::IntVect>,amrex::FabArrayBase::TileArray,std::less<std::pair<amrex::IntVect,amrex::IntVect>>,std::allocator<std::pair<std::pair<amrex::IntVect,amrex::IntVect>const,amrex::FabArrayBase::TileArray>>>>>>
      ::erase_abi_cxx11_((map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
                          *)this_01,__position);
    }
  }
  return;
}

Assistant:

void
FabArrayBase::flushTileArray (const IntVect& tileSize, bool no_assertion) const
{
    amrex::ignore_unused(no_assertion);
    BL_ASSERT(no_assertion || getBDKey() == m_bdkey);

    TACache& tao = m_TheTileArrayCache;
    TACache::iterator tao_it = tao.find(m_bdkey);
    if(tao_it != tao.end())
    {
        if (tileSize == IntVect::TheZeroVector())
        {
            for (TAMap::const_iterator tai_it = tao_it->second.begin();
                 tai_it != tao_it->second.end(); ++tai_it)
            {
#ifdef AMREX_MEM_PROFILING
                m_TAC_stats.bytes -= tai_it->second.bytes();
#endif
                m_TAC_stats.recordErase(tai_it->second.nuse);
            }
            tao.erase(tao_it);
        }
        else
        {
            TAMap& tai = tao_it->second;
            const IntVect& crse_ratio = boxArray().crseRatio();
            TAMap::iterator tai_it = tai.find(std::pair<IntVect,IntVect>(tileSize,crse_ratio));
            if (tai_it != tai.end()) {
#ifdef AMREX_MEM_PROFILING
                m_TAC_stats.bytes -= tai_it->second.bytes();
#endif
                m_TAC_stats.recordErase(tai_it->second.nuse);
                tai.erase(tai_it);
            }
        }
    }
}